

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O2

LogDestination * google::LogDestination::log_destination(LogSeverity severity)

{
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> __p;
  LogDestination *pLVar1;
  uint in_EDI;
  uint local_2c [3];
  __uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> local_20;
  
  pLVar1 = (LogDestination *)(&log_destinations_)[in_EDI];
  if (pLVar1 == (LogDestination *)0x0) {
    local_2c[1] = 0;
    local_2c[2] = 0;
    local_2c[0] = in_EDI;
    std::make_unique<google::LogDestination,google::LogSeverity&,decltype(nullptr)>
              ((LogSeverity *)&local_20,(void **)local_2c);
    __p._M_t.
    super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>.
    super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
         local_20._M_t.
         super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
         .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl;
    local_20._M_t.
    super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>.
    super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl =
         (tuple<google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
         (_Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>)
         0x0;
    std::__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    reset((__uniq_ptr_impl<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
          (&log_destinations_ + local_2c[0]),
          (pointer)__p._M_t.
                   super__Tuple_impl<0UL,_google::LogDestination_*,_std::default_delete<google::LogDestination>_>
                   .super__Head_base<0UL,_google::LogDestination_*,_false>._M_head_impl);
    std::unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_>::
    ~unique_ptr((unique_ptr<google::LogDestination,_std::default_delete<google::LogDestination>_> *)
                &local_20);
    pLVar1 = (LogDestination *)(&log_destinations_)[local_2c[0]];
  }
  return pLVar1;
}

Assistant:

inline LogDestination* LogDestination::log_destination(LogSeverity severity) {
  if (log_destinations_[severity] == nullptr) {
    log_destinations_[severity] =
        std::make_unique<LogDestination>(severity, nullptr);
  }
  return log_destinations_[severity].get();
}